

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

CURLcode http2_data_setup(Curl_cfilter *cf,Curl_easy *data,stream_ctx **pstream)

{
  HTTP *pHVar1;
  void *pvVar2;
  stream_ctx *psVar3;
  bufc_pool *pool;
  CURLcode CVar4;
  
  pHVar1 = (data->req).p.http;
  if (pHVar1 == (HTTP *)0x0) {
    Curl_failf(data,"initialization failure, transfer not http initialized");
    CVar4 = CURLE_FAILED_INIT;
  }
  else {
    if (data == (Curl_easy *)0x0) {
      psVar3 = (stream_ctx *)0x0;
    }
    else {
      psVar3 = (stream_ctx *)pHVar1->h2_ctx;
    }
    if (psVar3 == (stream_ctx *)0x0) {
      pvVar2 = cf->ctx;
      psVar3 = (stream_ctx *)(*Curl_ccalloc)(1,0x158);
      if (psVar3 == (stream_ctx *)0x0) {
        CVar4 = CURLE_OUT_OF_MEMORY;
      }
      else {
        psVar3->id = -1;
        pool = (bufc_pool *)((long)pvVar2 + 0x98);
        CVar4 = CURLE_OK;
        Curl_bufq_initp(&psVar3->sendbuf,pool,4,0);
        Curl_bufq_initp(&psVar3->recvbuf,pool,0x280,1);
        Curl_h1_req_parse_init(&psVar3->h1,0x100000);
        Curl_dynhds_init(&psVar3->resp_trailers,0,0x100000);
        psVar3->resp_hds_len = 0;
        psVar3->status_code = -1;
        psVar3->closed = false;
        psVar3->close_handled = false;
        psVar3->bodystarted = false;
        psVar3->error = 0;
        psVar3->local_window_size = 0xa00000;
        psVar3->upload_left = 0;
        ((data->req).p.http)->h2_ctx = psVar3;
        *pstream = psVar3;
      }
    }
    else {
      *pstream = psVar3;
      CVar4 = CURLE_OK;
    }
  }
  return CVar4;
}

Assistant:

static CURLcode http2_data_setup(struct Curl_cfilter *cf,
                                 struct Curl_easy *data,
                                 struct stream_ctx **pstream)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  struct stream_ctx *stream;

  (void)cf;
  DEBUGASSERT(data);
  if(!data->req.p.http) {
    failf(data, "initialization failure, transfer not http initialized");
    return CURLE_FAILED_INIT;
  }
  stream = H2_STREAM_CTX(data);
  if(stream) {
    *pstream = stream;
    return CURLE_OK;
  }

  stream = calloc(1, sizeof(*stream));
  if(!stream)
    return CURLE_OUT_OF_MEMORY;

  stream->id = -1;
  Curl_bufq_initp(&stream->sendbuf, &ctx->stream_bufcp,
                  H2_STREAM_SEND_CHUNKS, BUFQ_OPT_NONE);
  Curl_bufq_initp(&stream->recvbuf, &ctx->stream_bufcp,
                  H2_STREAM_RECV_CHUNKS, BUFQ_OPT_SOFT_LIMIT);
  Curl_h1_req_parse_init(&stream->h1, H1_PARSE_DEFAULT_MAX_LINE_LEN);
  Curl_dynhds_init(&stream->resp_trailers, 0, DYN_HTTP_REQUEST);
  stream->resp_hds_len = 0;
  stream->bodystarted = FALSE;
  stream->status_code = -1;
  stream->closed = FALSE;
  stream->close_handled = FALSE;
  stream->error = NGHTTP2_NO_ERROR;
  stream->local_window_size = H2_STREAM_WINDOW_SIZE;
  stream->upload_left = 0;

  H2_STREAM_LCTX(data) = stream;
  *pstream = stream;
  return CURLE_OK;
}